

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O3

void aes_cbc_sw_encrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  ssh_cipheralg *psVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ssh_cipheralg *psVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint8_t *blk;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ssh_cipher *psVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar66;
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  ushort local_70;
  uint8_t *out;
  
  auVar11 = _DAT_00180aa0;
  auVar10 = _DAT_00180a90;
  auVar9 = _DAT_00180a80;
  auVar8 = _DAT_00180a70;
  auVar7 = _DAT_00180a60;
  auVar6 = _DAT_00180a50;
  if (0 < blklen) {
    puVar16 = (ulong *)((long)blklen + (long)vblk);
    do {
      psVar17 = (ssh_cipheralg *)(*vblk ^ (ulong)ciph[-0xb].vt);
      ciph[-0xb].vt = psVar17;
      psVar21 = (ssh_cipheralg *)(*(ulong *)((long)vblk + 8) ^ (ulong)ciph[-10].vt);
      ciph[-10].vt = psVar21;
      uVar26 = (((ulong)psVar17 >> 7 ^ (ulong)psVar17) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar17;
      uVar24 = (((ulong)psVar21 >> 7 ^ (ulong)psVar21) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar21;
      uVar26 = ((uVar26 >> 0xe ^ uVar26) & 0xcccc0000cccc) * 0x4001 ^ uVar26;
      uVar24 = ((uVar24 >> 0xe ^ uVar24) & 0xcccc0000cccc) * 0x4001 ^ uVar24;
      uVar22 = (ulong)(((uint)(uVar26 >> 0x1c) ^ (uint)uVar26) & 0xf0f0f0f0);
      uVar26 = (uVar22 << 0x1c | uVar22) ^ uVar26;
      uVar22 = (ulong)(((uint)(uVar24 >> 0x1c) ^ (uint)uVar24) & 0xf0f0f0f0);
      uVar24 = (uVar22 << 0x1c | uVar22) ^ uVar24;
      uVar22 = (uVar26 >> 8 ^ uVar24) & 0xff00ff00ff00ff;
      uVar26 = uVar22 << 8 ^ uVar26;
      uVar22 = uVar22 ^ uVar24;
      uVar42 = (uint)(ushort)(*(ushort *)&ciph[-0x2a].vt ^ (ushort)uVar26);
      uVar25 = (uint)(ushort)(*(ushort *)((long)&ciph[-0x2a].vt + 2) ^ (ushort)uVar22);
      uVar29 = (uint)(ushort)((ushort)(uVar26 >> 0x10) ^ *(ushort *)((long)&ciph[-0x2a].vt + 4));
      uVar18 = (uint)(ushort)((ushort)(uVar22 >> 0x10) ^ *(ushort *)((long)&ciph[-0x2a].vt + 6));
      uVar66 = (ushort)(uVar26 >> 0x30);
      uVar19 = CONCAT22(uVar66,(ushort)(uVar26 >> 0x20) ^ *(ushort *)&ciph[-0x29].vt);
      uVar4 = (ushort)(uVar22 >> 0x30);
      uVar39 = CONCAT22(uVar4,(ushort)(uVar22 >> 0x20) ^ *(ushort *)((long)&ciph[-0x29].vt + 2));
      uVar43 = (uint)(uVar66 ^ *(ushort *)((long)&ciph[-0x29].vt + 4));
      uVar20 = (uint)(uVar4 ^ *(ushort *)((long)&ciph[-0x29].vt + 6));
      iVar3 = *(int *)&ciph[-0xc].vt;
      psVar38 = ciph + -0x28;
      while (iVar3 = iVar3 + -1, iVar3 != 0) {
        uVar12 = uVar19 ^ uVar29;
        uVar23 = uVar20 ^ uVar25;
        uVar13 = uVar20 ^ uVar19;
        uVar39 = uVar39 ^ uVar43;
        uVar14 = uVar20 ^ uVar29;
        uVar15 = uVar39 ^ uVar42;
        uVar27 = uVar23 ^ uVar12;
        uVar29 = uVar29 ^ uVar18 ^ uVar27;
        uVar43 = uVar18 ^ uVar27 ^ uVar43;
        uVar30 = uVar43 ^ uVar13;
        auVar48._8_8_ = 0;
        auVar48._0_8_ =
             (ulong)uVar42 & 0xffffffff0000ffff | (ulong)(ushort)(uVar19 ^ uVar15) << 0x10;
        uVar25 = uVar25 ^ uVar15;
        uVar35 = uVar29 ^ uVar39;
        uVar40 = uVar35 & uVar14 ^ uVar30 & uVar13;
        uVar18 = (uVar35 ^ uVar30) & uVar12 ^ uVar30 & uVar13;
        uVar39 = uVar39 ^ uVar30;
        uVar44 = uVar43 ^ uVar29 & uVar27 ^ (uVar29 ^ uVar42) & (uVar25 ^ uVar14) ^ uVar18;
        uVar18 = uVar25 & uVar15 ^ uVar39 ^ uVar39 & uVar23 ^ uVar23 ^ uVar18;
        uVar43 = (uVar19 ^ uVar15) & uVar42 ^ uVar14 ^ uVar35 ^ uVar29 & uVar27 ^ uVar40;
        uVar40 = uVar39 & uVar23 ^ uVar20 ^ (uVar30 ^ uVar42) & (uVar15 ^ uVar20) ^ uVar39 ^ uVar40;
        uVar19 = uVar18 & uVar44;
        uVar44 = uVar44 ^ uVar43;
        uVar41 = (uVar40 ^ uVar19) & uVar44 ^ uVar43;
        uVar33 = (uVar43 ^ uVar19) & (uVar40 ^ uVar18);
        uVar43 = uVar33 ^ uVar40;
        uVar33 = (uVar33 ^ uVar19) & uVar40;
        uVar18 = uVar18 ^ uVar33;
        uVar44 = (uVar33 ^ uVar40 ^ uVar19) & uVar41 ^ uVar44;
        uVar39 = uVar39 & (uVar44 ^ uVar41);
        uVar23 = (uVar44 ^ uVar41) & uVar23;
        uVar31 = uVar44 ^ uVar18 ^ uVar43;
        uVar33 = uVar41 ^ uVar43;
        uVar19 = (uVar35 ^ uVar30) & (uVar31 ^ uVar33);
        uVar12 = (uVar31 ^ uVar33) & uVar12;
        uVar40 = uVar30 & uVar33 ^ uVar39 ^ uVar19;
        uVar39 = uVar39 ^ uVar29 & uVar18;
        uVar66 = (ushort)(uVar18 ^ uVar43);
        uVar33 = uVar33 & uVar13 ^ uVar12;
        auVar51 = pshuflw(ZEXT416(uVar43),ZEXT416(uVar43),0);
        uVar13 = SUB164(auVar48 & auVar51,0) ^ uVar23 ^ uVar39;
        uVar28 = uVar33 ^ uVar15 & uVar44;
        uVar43 = uVar15 & uVar44 ^ uVar40;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = (ulong)uVar40 & 0xffffffff0000ffff | (ulong)(ushort)uVar43 << 0x10;
        uVar35 = uVar35 & uVar31 ^ uVar19 ^ uVar28;
        local_70 = (ushort)(uVar25 ^ uVar14);
        uVar24 = ((ulong)(uVar30 ^ uVar42) & 0xffffffff0000ffff | (ulong)local_70 << 0x10) &
                 ((ulong)uVar41 & 0xffffffff0000ffff | (ulong)uVar66 << 0x10);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar24;
        uVar25 = (uint)uVar24 ^ uVar44 & uVar25;
        uVar23 = uVar23 ^ uVar25 ^ uVar35;
        uVar40 = (uVar23 >> 8 ^ uVar23) & 0xcc;
        uVar35 = (uVar15 ^ uVar20) & uVar41 ^ uVar13 ^ uVar35;
        uVar25 = uVar13 ^ uVar33 ^ uVar25;
        uVar19 = (uVar25 >> 8 ^ uVar25) & 0xcc;
        uVar40 = (uVar40 << 8 | uVar40) ^ uVar23;
        uVar19 = (uVar19 << 8 | uVar19) ^ uVar25;
        uVar13 = uVar19 & 0x5555 | (uVar19 & 0xfffffffa) << 0xc;
        uVar20 = uVar19 >> 4 & 0xaaa;
        uVar15 = uVar40 >> 4 & 0xaaa;
        uVar24 = ((ulong)(uVar31 & uVar14) & 0xffffffff0000ffff |
                 (ulong)(ushort)((ushort)(uVar24 >> 0x10) ^ (ushort)uVar18 & (ushort)uVar27) << 0x10
                 ) ^ ((ulong)uVar12 & 0xffffffff0000ffff | (ulong)(ushort)uVar28 << 0x10);
        uVar18 = uVar40 & 0x5555 | (uVar40 & 0xfffffffa) << 0xc;
        uVar26 = ((ulong)uVar43 & 0xffffffff0000ffff |
                 (ulong)((ushort)(uVar29 ^ uVar42) & uVar66) << 0x10) ^ uVar24;
        uVar22 = ((ulong)uVar35 & 0xffffffff0000ffff | (ulong)(ushort)uVar39 << 0x10) ^ uVar26;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar22;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar26 >> 0x10 | (ulong)(ushort)uVar35 << 0x10;
        auVar46 = auVar48 & auVar51 ^ auVar47 ^ auVar46;
        uVar19 = ((uVar13 & 0xeeee | uVar20) >> 1) + (uVar25 & 0xfffff111) * 8;
        uVar20 = (uVar13 | uVar20) ^ uVar19;
        uVar25 = ((uVar18 & 0xeeee | uVar15) >> 1) + (uVar23 & 0xfffff111) * 8;
        uVar29 = (uVar18 | uVar15) ^ uVar25;
        auVar56._0_2_ = auVar46._0_2_ >> 8;
        auVar56._2_2_ = auVar46._2_2_ >> 8;
        auVar56._4_4_ = 0;
        auVar56._8_2_ = auVar46._8_2_ >> 8;
        auVar56._10_2_ = auVar46._10_2_ >> 8;
        auVar56._12_2_ = auVar46._12_2_ >> 8;
        auVar56._14_2_ = auVar46._14_2_ >> 8;
        auVar51 = (auVar56 ^ auVar46) & auVar6;
        auVar48 = psllw(auVar51,8);
        auVar49._0_2_ = auVar48._0_2_ + auVar51._0_2_;
        auVar49._2_2_ = auVar48._2_2_ + auVar51._2_2_;
        auVar49._4_2_ = auVar48._4_2_ + auVar51._4_2_;
        auVar49._6_2_ = auVar48._6_2_ + auVar51._6_2_;
        auVar49._8_2_ = auVar48._8_2_ + auVar51._8_2_;
        auVar49._10_2_ = auVar48._10_2_ + auVar51._10_2_;
        auVar49._12_2_ = auVar48._12_2_ + auVar51._12_2_;
        auVar49._14_2_ = auVar48._14_2_ + auVar51._14_2_;
        auVar49 = auVar49 ^ auVar46;
        auVar61._0_2_ = auVar49._0_2_ >> 4;
        auVar61._2_2_ = auVar49._2_2_ >> 4;
        auVar61._4_4_ = 0;
        auVar61._8_2_ = auVar49._8_2_ >> 4;
        auVar61._10_2_ = auVar49._10_2_ >> 4;
        auVar61._12_2_ = auVar49._12_2_ >> 4;
        auVar61._14_2_ = auVar49._14_2_ >> 4;
        auVar47 = psllw(auVar49,0xc);
        auVar48 = psllw(auVar46,3);
        uVar66 = (ushort)(uVar22 >> 0x10);
        uVar5 = CONCAT22(uVar66,(short)(uVar24 >> 0x10));
        auVar67._4_4_ = uVar5;
        auVar67._0_4_ = uVar5;
        auVar67._8_4_ = uVar5;
        auVar67._12_4_ = uVar5;
        auVar67 = auVar67 ^ auVar60;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = CONCAT22(uVar66 >> 8,(ushort)uVar22 >> 8) ^ uVar22;
        auVar52 = auVar52 & auVar6;
        auVar46 = psllw(auVar52,8);
        auVar57._0_2_ = auVar46._0_2_ + auVar52._0_2_;
        auVar57._2_2_ = auVar46._2_2_ + auVar52._2_2_;
        auVar57._4_2_ = auVar46._4_2_;
        auVar57._6_2_ = auVar46._6_2_;
        auVar57._8_2_ = auVar46._8_2_ + auVar52._8_2_;
        auVar57._10_2_ = auVar46._10_2_ + auVar52._10_2_;
        auVar57._12_2_ = auVar46._12_2_ + auVar52._12_2_;
        auVar57._14_2_ = auVar46._14_2_ + auVar52._14_2_;
        iVar1 = (uVar20 >> 2 & 0x3333) + (uVar20 & 0x3333) * 4;
        auVar57 = auVar57 ^ auVar65;
        auVar53._0_2_ = auVar57._0_2_ >> 4;
        auVar53._2_2_ = auVar57._2_2_ >> 4;
        auVar53._4_4_ = 0;
        auVar53._8_2_ = auVar57._8_2_ >> 4;
        auVar53._10_2_ = auVar57._10_2_ >> 4;
        auVar53._12_2_ = auVar57._12_2_ >> 4;
        auVar53._14_2_ = auVar57._14_2_ >> 4;
        auVar51 = psllw(auVar57,0xc);
        auVar46 = auVar49 & auVar9 | auVar47 & auVar8 | auVar61 & auVar7;
        auVar49 = auVar57 & auVar9 | auVar51 & auVar8 | auVar53 & auVar7;
        auVar62._0_2_ = auVar67._0_2_ >> 8;
        auVar62._2_2_ = auVar67._2_2_ >> 8;
        auVar62._4_2_ = auVar67._4_2_ >> 8;
        auVar62._6_2_ = auVar67._6_2_ >> 8;
        auVar62._8_2_ = auVar67._8_2_ >> 8;
        auVar62._10_2_ = auVar67._10_2_ >> 8;
        auVar62._12_2_ = auVar67._12_2_ >> 8;
        auVar62._14_2_ = auVar67._14_2_ >> 8;
        auVar47 = (auVar62 ^ auVar67) & auVar6;
        auVar59._0_2_ = auVar46._0_2_ >> 1;
        auVar59._2_2_ = auVar46._2_2_ >> 1;
        auVar59._4_4_ = 0;
        auVar59._8_2_ = auVar46._8_2_ >> 1;
        auVar59._10_2_ = auVar46._10_2_ >> 1;
        auVar59._12_2_ = auVar46._12_2_ >> 1;
        auVar59._14_2_ = auVar46._14_2_ >> 1;
        auVar51 = psllw(auVar47,8);
        auVar54._0_2_ = auVar51._0_2_ + auVar47._0_2_;
        auVar54._2_2_ = auVar51._2_2_ + auVar47._2_2_;
        auVar54._4_2_ = auVar51._4_2_ + auVar47._4_2_;
        auVar54._6_2_ = auVar51._6_2_ + auVar47._6_2_;
        auVar54._8_2_ = auVar51._8_2_ + auVar47._8_2_;
        auVar54._10_2_ = auVar51._10_2_ + auVar47._10_2_;
        auVar54._12_2_ = auVar51._12_2_ + auVar47._12_2_;
        auVar54._14_2_ = auVar51._14_2_ + auVar47._14_2_;
        auVar54 = auVar54 ^ auVar67;
        auVar63._0_2_ = auVar54._0_2_ >> 4;
        auVar63._2_2_ = auVar54._2_2_ >> 4;
        auVar63._4_4_ = 0;
        auVar63._8_2_ = auVar54._8_2_ >> 4;
        auVar63._10_2_ = auVar54._10_2_ >> 4;
        auVar63._12_2_ = auVar54._12_2_ >> 4;
        auVar63._14_2_ = auVar54._14_2_ >> 4;
        auVar60 = auVar59 & auVar11 | auVar48 & auVar10;
        auVar48 = psllw(auVar54,0xc);
        auVar47 = auVar54 & auVar9 | auVar48 & auVar8 | auVar63 & auVar7;
        auVar48 = psllw(auVar65,3);
        uVar12 = auVar60._0_4_ ^ auVar46._0_4_;
        auVar64._0_2_ = auVar49._0_2_ >> 1;
        auVar64._2_2_ = auVar49._2_2_ >> 1;
        auVar64._4_4_ = 0;
        auVar64._8_2_ = auVar49._8_2_ >> 1;
        auVar64._10_2_ = auVar49._10_2_ >> 1;
        auVar64._12_2_ = auVar49._12_2_ >> 1;
        auVar64._14_2_ = auVar49._14_2_ >> 1;
        auVar52 = auVar64 & auVar11 | auVar48 & auVar10;
        uVar13 = auVar52._0_4_ ^ auVar49._0_4_;
        auVar48 = psllw(auVar67,3);
        auVar51._0_2_ = auVar47._0_2_ >> 1;
        auVar51._2_2_ = auVar47._2_2_ >> 1;
        auVar51._4_4_ = 0;
        auVar51._8_2_ = auVar47._8_2_ >> 1;
        auVar51._10_2_ = auVar47._10_2_ >> 1;
        auVar51._12_2_ = auVar47._12_2_ >> 1;
        auVar51._14_2_ = auVar47._14_2_ >> 1;
        auVar48 = auVar51 & auVar11 | auVar48 & auVar10;
        iVar2 = (uVar29 >> 2 & 0x3333) + (uVar29 & 0x3333) * 4;
        uVar43 = SUB164(auVar48 ^ auVar47,0);
        auVar50._8_8_ = auVar46._8_8_;
        auVar50._0_8_ =
             auVar46._0_8_ & 0xffffffffffff0000 |
             (ulong)(ushort)(((ushort)(uVar12 >> 2) & 0x3333) + ((ushort)uVar12 & 0x3333) * 4 ^
                            *(ushort *)((long)&psVar38->vt + 6));
        auVar58._8_8_ = auVar49._8_8_;
        auVar58._0_8_ =
             auVar49._0_8_ & 0xffffffffffff0000 |
             (ulong)(ushort)(((ushort)(uVar13 >> 2) & 0x3333) + ((ushort)uVar13 & 0x3333) * 4 ^
                            *(ushort *)((long)&psVar38[1].vt + 2));
        uVar66 = SUB162(auVar58 ^ auVar52,2);
        uVar4 = SUB162(auVar50 ^ auVar60,2);
        uVar39 = SUB164(auVar58 ^ auVar52,0) ^ (uint)uVar66;
        uVar42 = CONCAT22((short)((uint)iVar1 >> 0x10),(ushort)iVar1 ^ *(ushort *)&psVar38->vt) ^
                 uVar19 ^ uVar43;
        uVar25 = uVar20 ^ uVar25 ^
                 CONCAT22((short)((uint)iVar2 >> 0x10),
                          (ushort)iVar2 ^ *(ushort *)((long)&psVar38->vt + 2)) ^ uVar43;
        iVar1 = (uVar66 >> 2 & 0x3333) + (uVar66 & 0x3333) * 4;
        uVar18 = uVar43 ^ SUB164(auVar50 ^ auVar60,0) ^ (uint)uVar4;
        iVar2 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333) * 4;
        auVar55._8_8_ = auVar47._8_8_;
        auVar55._0_8_ =
             auVar47._0_8_ & 0xffffffffffff0000 |
             (ulong)(ushort)(((ushort)(uVar43 >> 2) & 0x3333) +
                             (SUB162(auVar48 ^ auVar47,0) & 0x3333) * 4 ^
                            *(ushort *)((long)&psVar38[1].vt + 6));
        uVar66 = SUB162(auVar55 ^ auVar48,2);
        uVar29 = auVar60._2_2_ ^ uVar29 ^
                 CONCAT22((short)((uint)iVar2 >> 0x10),
                          (ushort)iVar2 ^ *(ushort *)((long)&psVar38->vt + 4));
        uVar20 = SUB164(auVar55 ^ auVar48,0) ^ (uint)uVar66;
        iVar2 = (uVar66 >> 2 & 0x3333) + (uVar66 & 0x3333) * 4;
        uVar19 = auVar52._2_2_ ^ uVar43 ^ uVar12 ^
                 CONCAT22((short)((uint)iVar1 >> 0x10),(ushort)iVar1 ^ *(ushort *)&psVar38[1].vt);
        uVar43 = auVar48._2_2_ ^ uVar13 ^
                 CONCAT22((short)((uint)iVar2 >> 0x10),
                          (ushort)iVar2 ^ *(ushort *)((long)&psVar38[1].vt + 4));
        psVar38 = psVar38 + 2;
      }
      uVar31 = uVar29 ^ uVar19;
      uVar12 = uVar25 ^ uVar20;
      uVar35 = uVar29 ^ uVar20;
      uVar39 = uVar39 ^ uVar43;
      uVar36 = uVar42 ^ uVar39;
      uVar34 = uVar19 ^ uVar20;
      uVar13 = uVar12 ^ uVar31;
      uVar29 = uVar29 ^ uVar18 ^ uVar13;
      uVar43 = uVar18 ^ uVar13 ^ uVar43;
      uVar18 = uVar29 ^ uVar39;
      uVar14 = uVar43 ^ uVar34;
      uVar15 = (uVar18 ^ uVar14) & uVar31 ^ uVar14 & uVar34;
      uVar23 = uVar18 & uVar35 ^ uVar14 & uVar34;
      uVar25 = uVar25 ^ uVar36;
      uVar39 = uVar39 ^ uVar14;
      uVar33 = uVar43 ^ uVar29 & uVar13 ^ (uVar29 ^ uVar42) & (uVar25 ^ uVar35) ^ uVar15;
      uVar15 = uVar25 & uVar36 ^ uVar39 ^ uVar39 & uVar12 ^ uVar12 ^ uVar15;
      uVar27 = (uVar36 ^ uVar19) & uVar42 ^ uVar35 ^ uVar18 ^ uVar29 & uVar13 ^ uVar23;
      uVar23 = uVar39 & uVar12 ^ uVar20 ^ (uVar14 ^ uVar42) & (uVar36 ^ uVar20) ^ uVar39 ^ uVar23;
      uVar43 = uVar15 & uVar33;
      uVar33 = uVar33 ^ uVar27;
      uVar40 = (uVar23 ^ uVar43) & uVar33 ^ uVar27;
      uVar27 = (uVar27 ^ uVar43) & (uVar23 ^ uVar15);
      uVar37 = uVar27 ^ uVar23;
      uVar27 = (uVar27 ^ uVar43) & uVar23;
      uVar15 = uVar15 ^ uVar27;
      uVar33 = (uVar27 ^ uVar23 ^ uVar43) & uVar40 ^ uVar33;
      uVar41 = uVar15 ^ uVar37;
      uVar45 = uVar33 ^ uVar41;
      uVar32 = uVar41 & (uVar25 ^ uVar35);
      uVar28 = uVar40 ^ uVar37;
      uVar39 = uVar39 & (uVar33 ^ uVar40);
      uVar12 = (uVar33 ^ uVar40) & uVar12;
      uVar43 = (uVar14 ^ uVar42) & uVar40;
      uVar44 = (uVar18 ^ uVar14) & (uVar45 ^ uVar28);
      uVar31 = (uVar45 ^ uVar28) & uVar31;
      uVar27 = uVar33 & uVar25 ^ uVar43;
      uVar30 = uVar29 & uVar15 ^ uVar39;
      uVar39 = uVar14 & uVar28 ^ uVar39 ^ uVar44;
      uVar23 = uVar12 ^ uVar42 & uVar37 ^ uVar30;
      uVar28 = uVar28 & uVar34 ^ uVar31;
      uVar14 = uVar23 ^ uVar27 ^ uVar28;
      uVar28 = uVar28 ^ uVar36 & uVar33;
      uVar44 = uVar18 & uVar45 ^ uVar44 ^ uVar28;
      uVar28 = uVar28 ^ uVar32 ^ uVar15 & uVar13;
      uVar25 = uVar36 & uVar33 ^ uVar39;
      uVar18 = (uVar29 ^ uVar42) & uVar41 ^ uVar28;
      uVar28 = uVar28 ^ uVar39;
      uVar39 = uVar40 & (uVar36 ^ uVar20) ^ uVar23 ^ uVar44;
      uVar44 = uVar44 ^ uVar12 ^ uVar27;
      uVar30 = uVar30 ^ uVar18;
      uVar18 = uVar18 ^ uVar43 ^ uVar42 & uVar37;
      uVar42 = uVar37 & (uVar36 ^ uVar19) ^ uVar32 ^ uVar39;
      uVar20 = uVar30 ^ uVar25;
      uVar39 = uVar45 & uVar35 ^ uVar31 ^ uVar25 ^ uVar39;
      uVar19 = (uVar14 >> 8 ^ uVar14) & 0xcc;
      uVar14 = (uVar19 << 8 | uVar19) ^ uVar14;
      uVar19 = (uVar44 >> 8 ^ uVar44) & 0xcc;
      uVar44 = (uVar19 << 8 | uVar19) ^ uVar44;
      uVar19 = (uVar42 >> 8 ^ uVar42) & 0xcc;
      uVar42 = (uVar19 << 8 | uVar19) ^ uVar42;
      uVar19 = (uVar18 >> 8 ^ uVar18) & 0xcc;
      uVar18 = (uVar19 << 8 | uVar19) ^ uVar18;
      uVar19 = (uVar30 >> 8 ^ uVar30) & 0xcc;
      uVar30 = (uVar19 << 8 | uVar19) ^ uVar30;
      uVar19 = (uVar39 >> 8 ^ uVar39) & 0xcc;
      uVar39 = (uVar19 << 8 | uVar19) ^ uVar39;
      uVar19 = (uVar20 >> 8 ^ uVar20) & 0xcc;
      uVar20 = (uVar19 << 8 | uVar19) ^ uVar20;
      uVar19 = (uVar28 >> 8 ^ uVar28) & 0xcc;
      uVar28 = (uVar19 << 8 | uVar19) ^ uVar28;
      uVar26 = CONCAT62(CONCAT42(CONCAT22(((ushort)uVar28 & 0x5555 |
                                           (ushort)((uVar28 & 0xfffffffa) << 0xc) |
                                          (ushort)(uVar28 >> 4) & 0xaaa) ^
                                          *(ushort *)((long)&psVar38[1].vt + 6),
                                          ((ushort)uVar39 & 0x5555 |
                                           (ushort)((uVar39 & 0xfffffffa) << 0xc) |
                                          (ushort)(uVar39 >> 4) & 0xaaa) ^
                                          *(ushort *)((long)&psVar38[1].vt + 2)),
                                 ((ushort)uVar18 & 0x5555 | (ushort)((uVar18 & 0xfffffffa) << 0xc) |
                                 (ushort)(uVar18 >> 4) & 0xaaa) ^
                                 *(ushort *)((long)&psVar38->vt + 6)),
                        ((ushort)uVar44 & 0x5555 | (ushort)((uVar44 & 0xfffffffa) << 0xc) |
                        (ushort)(uVar44 >> 4) & 0xaaa) ^ *(ushort *)((long)&psVar38->vt + 2));
      uVar22 = CONCAT62(CONCAT42(CONCAT22(((ushort)uVar20 & 0x5555 |
                                           (ushort)((uVar20 & 0xfffffffa) << 0xc) |
                                          (ushort)(uVar20 >> 4) & 0xaaa) ^
                                          *(ushort *)((long)&psVar38[1].vt + 4),
                                          ((ushort)uVar30 & 0x5555 |
                                           (ushort)((uVar30 & 0xfffffffa) << 0xc) |
                                          (ushort)(uVar30 >> 4) & 0xaaa) ^ *(ushort *)&psVar38[1].vt
                                         ),
                                 ((ushort)uVar42 & 0x5555 | (ushort)((uVar42 & 0xfffffffa) << 0xc) |
                                 (ushort)(uVar42 >> 4) & 0xaaa) ^
                                 *(ushort *)((long)&psVar38->vt + 4)),
                        ((ushort)uVar14 & 0x5555 | (ushort)((uVar14 & 0xfffffffa) << 0xc) |
                        (ushort)(uVar14 >> 4) & 0xaaa) ^ *(ushort *)&psVar38->vt);
      uVar24 = (uVar22 >> 8 ^ uVar26) & 0xff00ff00ff00ff;
      uVar22 = uVar24 << 8 ^ uVar22;
      uVar24 = uVar24 ^ uVar26;
      uVar26 = (ulong)(((uint)(uVar22 >> 0x1c) ^ (uint)uVar22) & 0xf0f0f0f0);
      uVar22 = (uVar26 << 0x1c | uVar26) ^ uVar22;
      uVar26 = (ulong)(((uint)(uVar24 >> 0x1c) ^ (uint)uVar24) & 0xf0f0f0f0);
      uVar24 = (uVar26 << 0x1c | uVar26) ^ uVar24;
      uVar22 = ((uVar22 >> 0xe ^ uVar22) & 0xcccc0000cccc) * 0x4001 ^ uVar22;
      uVar24 = ((uVar24 >> 0xe ^ uVar24) & 0xcccc0000cccc) * 0x4001 ^ uVar24;
      uVar22 = ((uVar22 >> 7 ^ uVar22) & 0xaa00aa00aa00aa) * 0x81 ^ uVar22;
      uVar24 = ((uVar24 >> 7 ^ uVar24) & 0xaa00aa00aa00aa) * 0x81 ^ uVar24;
      *(char *)&ciph[-0xb].vt = (char)uVar22;
      *(char *)((long)&ciph[-0xb].vt + 1) = (char)(uVar22 >> 8);
      *(char *)((long)&ciph[-0xb].vt + 2) = (char)(uVar22 >> 0x10);
      *(char *)((long)&ciph[-0xb].vt + 3) = (char)(uVar22 >> 0x18);
      *(char *)((long)&ciph[-0xb].vt + 4) = (char)(uVar22 >> 0x20);
      *(char *)((long)&ciph[-0xb].vt + 5) = (char)(uVar22 >> 0x28);
      *(char *)((long)&ciph[-0xb].vt + 6) = (char)(uVar22 >> 0x30);
      *(char *)((long)&ciph[-0xb].vt + 7) = (char)(uVar22 >> 0x38);
      *(char *)&ciph[-10].vt = (char)uVar24;
      *(char *)((long)&ciph[-10].vt + 1) = (char)(uVar24 >> 8);
      *(char *)((long)&ciph[-10].vt + 2) = (char)(uVar24 >> 0x10);
      *(char *)((long)&ciph[-10].vt + 3) = (char)(uVar24 >> 0x18);
      *(char *)((long)&ciph[-10].vt + 4) = (char)(uVar24 >> 0x20);
      *(char *)((long)&ciph[-10].vt + 5) = (char)(uVar24 >> 0x28);
      *(char *)((long)&ciph[-10].vt + 6) = (char)(uVar24 >> 0x30);
      *(char *)((long)&ciph[-10].vt + 7) = (char)(uVar24 >> 0x38);
      psVar17 = ciph[-10].vt;
      *(ssh_cipheralg **)vblk = ciph[-0xb].vt;
      *(ssh_cipheralg **)((long)vblk + 8) = psVar17;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < puVar16);
  }
  return;
}

Assistant:

static inline void aes_cbc_sw_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * CBC encryption has to be done serially, because the input to
     * each run of the cipher includes the output from the previous
     * run.
     */

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        /*
         * We use the IV array itself as the location for the
         * encryption, because there's no reason not to.
         */

        /* XOR the new plaintext block into the previous cipher block */
        memxor16(ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, blk);

        /* Run the cipher over the result, which leaves it
         * conveniently already stored in ctx->iv */
        aes_sliced_e_serial(
            ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, &ctx->sk);

        /* Copy it to the output location */
        memcpy(blk, ctx->iv.cbc.prevblk, 16);
    }
}